

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O3

uint64_t aom_var_2d_u8_avx2(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  undefined4 uVar12;
  undefined1 (*pauVar13) [32];
  ulong uVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  __m256i vsrc [8];
  undefined8 local_160 [39];
  
  if (width < 0x20) {
    uVar9 = 0;
    lVar8 = 0;
    lVar7 = 0;
  }
  else {
    uVar9 = 0;
    lVar7 = 0;
    lVar8 = 0;
    do {
      pauVar13 = (undefined1 (*) [32])(src + uVar9);
      auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if (height < 8) {
        uVar10 = 0;
      }
      else {
        iVar15 = 0;
        do {
          lVar11 = 0;
          do {
            uVar4 = *(undefined8 *)(*pauVar13 + 8);
            uVar5 = *(undefined8 *)(*pauVar13 + 0x10);
            uVar6 = *(undefined8 *)(*pauVar13 + 0x18);
            *(undefined8 *)((long)local_160 + lVar11) = *(undefined8 *)*pauVar13;
            *(undefined8 *)((long)local_160 + lVar11 + 8) = uVar4;
            *(undefined8 *)((long)local_160 + lVar11 + 0x10) = uVar5;
            *(undefined8 *)((long)local_160 + lVar11 + 0x18) = uVar6;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + src_stride);
            lVar11 = lVar11 + 0x20;
          } while (lVar11 != 0x100);
          auVar18 = ZEXT1664((undefined1  [16])0x0);
          auVar20 = ZEXT1664((undefined1  [16])0x0);
          lVar11 = 0;
          do {
            auVar17 = vpunpcklbw_avx2(*(undefined1 (*) [32])((long)local_160 + lVar11),auVar16);
            auVar3 = vpunpckhbw_avx2(*(undefined1 (*) [32])((long)local_160 + lVar11),auVar16);
            auVar19 = vpaddw_avx2(auVar20._0_32_,auVar17);
            auVar19 = vpaddw_avx2(auVar19,auVar3);
            auVar20 = ZEXT3264(auVar19);
            auVar17 = vpmaddwd_avx2(auVar17,auVar17);
            auVar17 = vpaddd_avx2(auVar17,auVar18._0_32_);
            auVar3 = vpmaddwd_avx2(auVar3,auVar3);
            auVar17 = vpaddd_avx2(auVar17,auVar3);
            auVar18 = ZEXT3264(auVar17);
            lVar11 = lVar11 + 0x20;
          } while (lVar11 != 0x100);
          auVar2 = vphaddw_avx(auVar19._16_16_,auVar19._0_16_);
          auVar2 = vphaddw_avx(auVar2,auVar2);
          auVar2 = vphaddw_avx(auVar2,auVar2);
          auVar2 = vphaddw_avx(auVar2,auVar2);
          uVar10 = vpextrw_avx(auVar2,0);
          auVar2 = vphaddd_avx(auVar17._16_16_,auVar17._0_16_);
          lVar7 = lVar7 + (ulong)uVar10;
          auVar2 = vphaddd_avx(auVar2,auVar2);
          auVar2 = vphaddd_avx(auVar2,auVar2);
          lVar8 = lVar8 + auVar2._0_4_;
          iVar15 = iVar15 + 8;
          uVar10 = height & 0xfffffff8;
        } while (iVar15 < height + -7);
      }
      iVar15 = height - uVar10;
      if (iVar15 == 0 || height < (int)uVar10) {
        auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar18 = ZEXT1664((undefined1  [16])0x0);
        auVar20 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar17 = vpunpcklbw_avx2(*pauVar13,auVar16);
          auVar3 = vpunpckhbw_avx2(*pauVar13,auVar16);
          auVar19 = vpaddw_avx2(auVar20._0_32_,auVar17);
          auVar19 = vpaddw_avx2(auVar19,auVar3);
          auVar20 = ZEXT3264(auVar19);
          auVar17 = vpmaddwd_avx2(auVar17,auVar17);
          auVar17 = vpaddd_avx2(auVar17,auVar18._0_32_);
          auVar3 = vpmaddwd_avx2(auVar3,auVar3);
          auVar17 = vpaddd_avx2(auVar17,auVar3);
          auVar18 = ZEXT3264(auVar17);
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + src_stride);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      auVar2 = vphaddw_avx(auVar19._16_16_,auVar19._0_16_);
      auVar2 = vphaddw_avx(auVar2,auVar2);
      auVar2 = vphaddw_avx(auVar2,auVar2);
      auVar2 = vphaddw_avx(auVar2,auVar2);
      uVar12 = vpextrw_avx(auVar2,0);
      auVar2 = vphaddd_avx(auVar17._16_16_,auVar17._0_16_);
      lVar7 = lVar7 + CONCAT44((int)((ulong)pauVar13 >> 0x20),uVar12);
      auVar2 = vphaddd_avx(auVar2,auVar2);
      auVar2 = vphaddd_avx(auVar2,auVar2);
      lVar8 = lVar8 + auVar2._0_4_;
      uVar9 = uVar9 + 0x20;
    } while (uVar9 < width - 0x1f);
  }
  if (0 < height) {
    iVar15 = 0;
    do {
      uVar14 = uVar9 & 0xffffffff;
      if ((int)uVar9 < width) {
        do {
          bVar1 = src[uVar14];
          lVar7 = lVar7 + (ulong)bVar1;
          lVar8 = lVar8 + (ulong)((uint)bVar1 * (uint)bVar1);
          uVar14 = uVar14 + 1;
        } while ((uint)width != uVar14);
      }
      src = src + src_stride;
      iVar15 = iVar15 + 1;
    } while (iVar15 != height);
  }
  return lVar8 - (ulong)(lVar7 * lVar7) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u8_avx2(uint8_t *src, int src_stride, int width,
                            int height) {
  uint8_t *srcp;
  uint64_t s = 0, ss = 0;
  __m256i vzero = _mm256_setzero_si256();
  __m256i v_acc_sum = vzero;
  __m256i v_acc_sqs = vzero;
  int i, j;

  // Process 32 elements in a row
  for (i = 0; i < width - 31; i += 32) {
    srcp = src + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 7; j += 8) {
      __m256i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm256_loadu_si256((__m256i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m256i vsrc0 = _mm256_unpacklo_epi8(vsrc[k], vzero);
        __m256i vsrc1 = _mm256_unpackhi_epi8(vsrc[k], vzero);
        v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc0);
        v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc1);

        __m256i vsqs0 = _mm256_madd_epi16(vsrc0, vsrc0);
        __m256i vsqs1 = _mm256_madd_epi16(vsrc1, vsrc1);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs1);
      }

      // Update total sum and clear the vectors
      s += mm256_accumulate_epi16(v_acc_sum);
      ss += mm256_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m256i vsrc = _mm256_loadu_si256((__m256i *)srcp);
      __m256i vsrc0 = _mm256_unpacklo_epi8(vsrc, vzero);
      __m256i vsrc1 = _mm256_unpackhi_epi8(vsrc, vzero);
      v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc0);
      v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc1);

      __m256i vsqs0 = _mm256_madd_epi16(vsrc0, vsrc0);
      __m256i vsqs1 = _mm256_madd_epi16(vsrc1, vsrc1);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs1);

      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm256_accumulate_epi16(v_acc_sum);
    ss += mm256_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = src;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint8_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}